

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> * __thiscall
LZ77Compressor::compress(LZ77Compressor *this,uint8_t *input,int inputLength)

{
  int in_EDX;
  LZ77Compressor *in_RSI;
  int *in_RDI;
  LZ77Compressor *unaff_retaddr;
  Item item;
  int matchLen;
  int matchOff;
  int i;
  ushort in_stack_ffffffffffffffd8;
  vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *in_stack_ffffffffffffffe0;
  int end;
  int *input_00;
  
  input_00 = in_RDI;
  clear(in_RSI);
  end = 0;
  while (end < in_EDX - *in_RDI) {
    next(unaff_retaddr,(uint8_t *)input_00,&in_RSI->maxMatch,in_EDX,end);
  }
  while (end < in_EDX + -2) {
    next(unaff_retaddr,(uint8_t *)input_00,&in_RSI->maxMatch,in_EDX,end);
  }
  for (; end < in_EDX; end = end + 1) {
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::push_back
              (in_stack_ffffffffffffffe0,
               (value_type *)
               (ulong)CONCAT14(*(undefined1 *)((long)in_RSI->dict + (long)end + -0x20),
                               (uint)in_stack_ffffffffffffffd8));
  }
  return (vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *)(in_RDI + 2);
}

Assistant:

const std::vector<Item>& compress(const uint8_t* input, int inputLength) {
		clear();
		int i = 0;
		int matchOff, matchLen;
		while (i < inputLength - maxMatch) {
			next(input, i, maxMatch, inputLength - 2);
		}
		while (i < inputLength - 2) {
			next(input, i, inputLength - i, inputLength - 2);
		}
		for (; i < inputLength; i++) {
			Item item = {0};
			item.isRepeat = false;
			item.value = input[i];
			output.push_back(item);
		}
		return output;
	}